

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

void __thiscall
cmCTestSVN::GuessBase
          (cmCTestSVN *this,SVNInfo *svninfo,
          vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes)

{
  pointer pCVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  char cVar5;
  pointer pCVar6;
  string base;
  string local_70;
  string local_50;
  
  cVar5 = (char)&svninfo->URL;
  lVar3 = std::__cxx11::string::find(cVar5,0x2f);
  if ((lVar3 != -1) && ((svninfo->Base)._M_string_length == 0)) {
    do {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&svninfo->URL);
      cmCTest::DecodeURL(&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (((svninfo->Base)._M_string_length == 0) &&
         (pCVar1 = (changes->
                   super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         pCVar1 != (changes->
                   super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                   )._M_impl.super__Vector_impl_data._M_finish)) {
        do {
          pCVar6 = pCVar1 + 1;
          bVar2 = cmCTestSVNPathStarts(&pCVar1->Path,&local_50);
          if (bVar2) {
            std::__cxx11::string::_M_assign((string *)&svninfo->Base);
          }
        } while (((svninfo->Base)._M_string_length == 0) &&
                (pCVar1 = pCVar6,
                pCVar6 != (changes->
                          super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                          )._M_impl.super__Vector_impl_data._M_finish));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar3 = std::__cxx11::string::find(cVar5,0x2f);
    } while ((lVar3 != -1) && ((svninfo->Base)._M_string_length == 0));
  }
  std::__cxx11::string::append((char *)&svninfo->Base);
  poVar4 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Guessed Base = ",0xf);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(svninfo->Base)._M_dataplus._M_p,(svninfo->Base)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  return;
}

Assistant:

void cmCTestSVN::GuessBase(SVNInfo& svninfo,
                           std::vector<Change> const& changes)
{
  // Subversion did not give us a good repository root so we need to
  // guess the base path from the URL and the paths in a revision with
  // changes under it.

  // Consider each possible URL suffix from longest to shortest.
  for (std::string::size_type slash = svninfo.URL.find('/');
       svninfo.Base.empty() && slash != std::string::npos;
       slash = svninfo.URL.find('/', slash + 1)) {
    // If the URL suffix is a prefix of at least one path then it is the base.
    std::string base = cmCTest::DecodeURL(svninfo.URL.substr(slash));
    for (std::vector<Change>::const_iterator ci = changes.begin();
         svninfo.Base.empty() && ci != changes.end(); ++ci) {
      if (cmCTestSVNPathStarts(ci->Path, base)) {
        svninfo.Base = base;
      }
    }
  }

  // We always append a slash so that we know paths beginning in the
  // base lie under its path.  If no base was found then the working
  // tree must be a checkout of the entire repo and this will match
  // the leading slash in all paths.
  svninfo.Base += "/";

  this->Log << "Guessed Base = " << svninfo.Base << "\n";
}